

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UBool __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UChar32 c,uint16_t norm16,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  undefined2 uVar1;
  uint16_t *puVar2;
  UBool UVar3;
  uint16_t uVar4;
  int iVar5;
  uint8_t uVar6;
  ushort uVar7;
  uint uVar8;
  UChar *sLimit;
  ulong uVar9;
  int iVar10;
  UChar jamos [3];
  UChar local_26;
  short local_24;
  UChar local_22;
  
  uVar8 = (uint)norm16;
  if (this->limitNoNo <= norm16) {
    if (this->minMaybeYes <= norm16) {
      uVar6 = '\0';
      if (0xfbff < norm16) {
        uVar6 = (uint8_t)(norm16 >> 1);
      }
      goto LAB_00295aeb;
    }
    c = ((uint)(norm16 >> 3) + c) - (uint)this->centerNoNoDelta;
    uVar4 = getRawNorm16(this,c);
    uVar8 = (uint)uVar4;
  }
  uVar7 = (ushort)uVar8;
  if (this->minYesNo <= uVar7) {
    if ((uVar7 == this->minYesNo) || (uVar1 = this->minYesNoMappingsOnly, (uVar1 | 1) == uVar7)) {
      iVar5 = c + -0xac00;
      iVar10 = c + (int)((ulong)((long)iVar5 * -0x6db6db6d) >> 0x20) + -0xac00;
      iVar10 = (iVar10 >> 4) - (iVar10 >> 0x1f);
      local_24 = (short)iVar10 + (short)(iVar10 / 0x15) * -0x15 + 0x1161;
      local_26 = ((short)((ulong)((long)iVar5 * 0x6f74ae27) >> 0x28) - (short)(iVar5 >> 0x1f)) +
                 L'ᄀ';
      iVar5 = iVar5 + iVar10 * -0x1c;
      if (iVar5 == 0) {
        sLimit = &local_22;
      }
      else {
        sLimit = (UChar *)&stack0xffffffffffffffe0;
        local_22 = (short)iVar5 + L'ᆧ';
      }
      UVar3 = ReorderingBuffer::appendZeroCC(buffer,&local_26,sLimit,errorCode);
    }
    else {
      puVar2 = this->extraData;
      uVar9 = (ulong)(uVar8 & 0xfffe);
      uVar7 = *(ushort *)((long)puVar2 + uVar9);
      if ((char)uVar7 < '\0') {
        uVar6 = *(uint8_t *)((long)puVar2 + (uVar9 - 1));
      }
      else {
        uVar6 = '\0';
      }
      UVar3 = ReorderingBuffer::append
                        (buffer,(UChar *)((long)puVar2 + uVar9 + 2),uVar7 & 0x1f,'\x01',uVar6,
                         (uint8_t)(uVar7 >> 8),errorCode);
    }
    return UVar3;
  }
  uVar6 = '\0';
LAB_00295aeb:
  UVar3 = ReorderingBuffer::append(buffer,c,uVar6,errorCode);
  return UVar3;
}

Assistant:

UBool Normalizer2Impl::decompose(UChar32 c, uint16_t norm16,
                                 ReorderingBuffer &buffer,
                                 UErrorCode &errorCode) const {
    // get the decomposition and the lead and trail cc's
    if (norm16 >= limitNoNo) {
        if (isMaybeOrNonZeroCC(norm16)) {
            return buffer.append(c, getCCFromYesOrMaybe(norm16), errorCode);
        }
        // Maps to an isCompYesAndZeroCC.
        c=mapAlgorithmic(c, norm16);
        norm16=getRawNorm16(c);
    }
    if (norm16 < minYesNo) {
        // c does not decompose
        return buffer.append(c, 0, errorCode);
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        UChar jamos[3];
        return buffer.appendZeroCC(jamos, jamos+Hangul::decompose(c, jamos), errorCode);
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    int32_t length=firstUnit&MAPPING_LENGTH_MASK;
    uint8_t leadCC, trailCC;
    trailCC=(uint8_t)(firstUnit>>8);
    if(firstUnit&MAPPING_HAS_CCC_LCCC_WORD) {
        leadCC=(uint8_t)(*(mapping-1)>>8);
    } else {
        leadCC=0;
    }
    return buffer.append((const UChar *)mapping+1, length, TRUE, leadCC, trailCC, errorCode);
}